

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
ModsIRCCommand::trigger
          (ModsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  size_type sVar5;
  pointer pPVar6;
  char *pcVar7;
  size_t sVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  __sv_type _Var10;
  size_t local_198;
  char *local_190;
  size_t local_178;
  basic_string_view<char,_std::char_traits<char>_> *local_170;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  _Self local_108;
  _Self local_100;
  iterator node;
  Server *server;
  uint local_dc;
  undefined1 auStack_d8 [4];
  uint i;
  string_view staff_word;
  string msg;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  ModsIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  local_170 = (basic_string_view<char,_std::char_traits<char>_> *)nick._M_len;
  pcVar7 = channel._M_str;
  sVar8 = channel._M_len;
  bVar9 = sv("show",4);
  bVar1 = jessilib::equalsi<char,char>(parameters,bVar9);
  if (bVar1) {
    ShowModsIRCCommand::trigger(&ShowModsIRCCommand_instance,source,channel,nick,parameters);
  }
  else {
    lVar3 = Jupiter::IRC::Client::getChannel(source,sVar8,pcVar7);
    if (lVar3 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      std::__cxx11::string::string((string *)&staff_word._M_str);
      _auStack_d8 = RenX_CommandsPlugin::getStaffTitle(&pluginInstance);
      local_dc = 0;
      while( true ) {
        RenX::getCore();
        uVar4 = RenX::Core::getServerCount();
        if (local_dc == uVar4) break;
        uVar4 = RenX::getCore();
        node._M_node = (_List_node_base *)RenX::Core::getServer(uVar4);
        bVar2 = RenX::Server::isLogChanType((int)node._M_node);
        if ((bVar2 & 1) != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &staff_word._M_str,"");
          sVar5 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                            ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                             (node._M_node + 1));
          if (sVar5 != 0) {
            local_100._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                           (node._M_node + 1);
            while( true ) {
              local_108._M_node =
                   (_List_node_base *)
                   std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                             (node._M_node + 1);
              bVar1 = std::operator==(&local_100,&local_108);
              if (((bVar1 ^ 0xffU) & 1) == 0) break;
              pPVar6 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_100);
              if ((pPVar6->isBot & 1U) == 0) {
                pPVar6 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_100);
                bVar1 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                  (&pPVar6->adminType);
                if (bVar1) {
                  pPVar6 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_100);
                  if (pPVar6->access == 0) goto LAB_00147aff;
                  pPVar6 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_100);
                  bVar1 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                    (&pPVar6->gamePrefix);
                  if (bVar1) {
                    pPVar6 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_100);
                    bVar1 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                      (&pPVar6->formatNamePrefix);
                    if (bVar1) goto LAB_00147aff;
                  }
                }
                bVar1 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&staff_word._M_str);
                if (bVar1) {
                  std::__cxx11::string::operator+=
                            ((string *)&staff_word._M_str,
                             (basic_string_view<char,_std::char_traits<char>_> *)auStack_d8);
                  local_118 = sv("s in-game: ",0xb);
                  std::__cxx11::string::operator+=((string *)&staff_word._M_str,&local_118);
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &staff_word._M_str,", ");
                }
                pPVar6 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_100);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &staff_word._M_str,&pPVar6->gamePrefix);
                pPVar6 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_100);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &staff_word._M_str,&pPVar6->name);
              }
LAB_00147aff:
              std::_List_iterator<RenX::PlayerInfo>::operator++(&local_100);
            }
          }
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &staff_word._M_str);
          if (bVar1) {
            local_148 = sv("No ",3);
            local_158 = sv("s are in-game.",0xe);
            jessilib::
            join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
                      (&local_138,(jessilib *)&local_148,
                       (basic_string_view<char,_std::char_traits<char>_> *)auStack_d8,&local_158,
                       local_170);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &staff_word._M_str,&local_138);
            std::__cxx11::string::~string((string *)&local_138);
          }
          _Var10 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)&staff_word._M_str);
          local_178 = _Var10._M_len;
          local_170 = (basic_string_view<char,_std::char_traits<char>_> *)_Var10._M_str;
          Jupiter::IRC::Client::sendMessage(source,sVar8,pcVar7,local_178);
        }
        local_dc = local_dc + 1;
      }
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &staff_word._M_str);
      if (bVar1) {
        bVar9 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_198 = bVar9._M_len;
        local_190 = bVar9._M_str;
        Jupiter::IRC::Client::sendMessage(source,sVar8,pcVar7,local_198,local_190);
      }
      std::__cxx11::string::~string((string *)&staff_word._M_str);
    }
  }
  return;
}

Assistant:

void ModsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (jessilib::equalsi(parameters, "show"sv)) {
		ShowModsIRCCommand_instance.trigger(source, channel, nick, parameters);
	}
	else {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string msg;
			std::string_view staff_word = pluginInstance.getStaffTitle();
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type)) {
					msg = "";
					if (server->players.size() != 0) {
						for (auto node = server->players.begin(); node != server->players.end(); ++node) {
							if (node->isBot == false && (!node->adminType.empty() || (node->access != 0 && (!node->gamePrefix.empty() || !node->formatNamePrefix.empty())))) {
								if (!msg.empty()) {
									msg += ", ";
								}
								else {
									msg += staff_word;
									msg += "s in-game: "sv;
								}
								msg += node->gamePrefix;
								msg += node->name;
							}
						}
					}
					if (msg.empty()) {
						msg = jessilib::join<std::string>("No "sv, staff_word, "s are in-game."sv);
					}
					source->sendMessage(channel, msg);
				}
			}
			if (msg.empty()) {
				source->sendMessage(channel,
					"Error: Channel not attached to any connected Renegade X servers."sv);
			}
		}
	}
}